

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

float __thiscall embree::XMLLoader::load<float>(XMLLoader *this,Ref<embree::XML> *xml,float *opt)

{
  size_type sVar1;
  runtime_error *this_00;
  float *in_RDX;
  long *in_RSI;
  ParseLocation *in_stack_00000008;
  char *__rhs;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff6c;
  string local_68 [31];
  undefined1 in_stack_ffffffffffffffb7;
  Token *in_stack_ffffffffffffffb8;
  float local_24;
  
  if (*in_RSI == 0) {
    local_24 = *in_RDX;
  }
  else {
    sVar1 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                      ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RSI + 0x98));
    if (sVar1 != 1) {
      uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffff68);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      __rhs = (char *)*in_RSI;
      ParseLocation::str_abi_cxx11_(in_stack_00000008);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff6c,uVar2),__rhs);
      std::runtime_error::runtime_error(this_00,local_68);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
              ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RSI + 0x98),0);
    local_24 = Token::Float(in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
  }
  return local_24;
}

Assistant:

float XMLLoader::load<float>(const Ref<XML>& xml, const float& opt) {
    if (xml == null) return opt;
    if (xml->body.size() != 1) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float body");
    return xml->body[0].Float();
  }